

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_y_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  int16_t *piVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  ushort *puVar10;
  byte bVar11;
  uint16_t uVar12;
  uint uVar13;
  int iVar14;
  ushort *puVar15;
  uint16_t *puVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong local_88;
  ushort *local_70;
  
  bVar8 = (byte)conv_params->round_1;
  cVar9 = (char)conv_params->round_0;
  cVar7 = bVar8 + cVar9;
  cVar6 = (char)bd - cVar7;
  if (0 < h) {
    pCVar4 = conv_params->dst;
    uVar1 = filter_params_y->taps;
    iVar14 = (1 << (cVar6 + 0xdU & 0x1f)) + (1 << (cVar6 + 0xeU & 0x1f));
    bVar11 = 0xe - cVar7;
    piVar5 = filter_params_y->filter_ptr;
    iVar2 = conv_params->dst_stride;
    lVar17 = (long)src_stride;
    local_70 = src + (1 - (ulong)(uVar1 >> 1)) * lVar17;
    local_88 = 0;
    do {
      if (0 < w) {
        iVar3 = conv_params->do_average;
        uVar21 = 0;
        puVar10 = local_70;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            iVar19 = 0;
          }
          else {
            uVar18 = 0;
            iVar19 = 0;
            puVar15 = puVar10;
            do {
              iVar19 = iVar19 + (uint)*puVar15 *
                                (int)*(short *)((long)piVar5 +
                                               uVar18 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
              uVar18 = uVar18 + 1;
              puVar15 = puVar15 + lVar17;
            } while (filter_params_y->taps != uVar18);
          }
          iVar19 = ((iVar19 << (7U - cVar9 & 0x1f)) + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)
                   ) + iVar14;
          if (iVar3 == 0) {
            uVar12 = (uint16_t)iVar19;
            puVar16 = pCVar4 + local_88 * (long)iVar2;
          }
          else {
            uVar20 = (uint)(pCVar4 + local_88 * (long)iVar2)[uVar21];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar19 = (int)(iVar19 + uVar20) >> 1;
            }
            else {
              iVar19 = (int)(iVar19 * conv_params->bck_offset + uVar20 * conv_params->fwd_offset) >>
                       4;
            }
            uVar20 = iVar19 + (((1 << (bVar11 & 0x1f)) >> 1) - iVar14) >> (bVar11 & 0x1f);
            if (bd == 10) {
              uVar13 = 0x3ff;
            }
            else if (bd == 0xc) {
              uVar13 = 0xfff;
            }
            else {
              uVar13 = 0xff;
            }
            if (uVar20 < uVar13) {
              uVar13 = uVar20;
            }
            uVar12 = (uint16_t)uVar13;
            puVar16 = dst + local_88 * (long)dst_stride;
            if ((int)uVar20 < 0) {
              uVar12 = 0;
            }
          }
          puVar16[uVar21] = uVar12;
          uVar21 = uVar21 + 1;
          puVar10 = puVar10 + 1;
        } while (uVar21 != (uint)w);
      }
      local_88 = local_88 + 1;
      local_70 = local_70 + lVar17;
    } while (local_88 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_y,
                                      const int subpel_y_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}